

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseType(Parser *this,Type *type)

{
  int iVar1;
  BaseType BVar2;
  EnumDef *pEVar3;
  StructDef *pSVar4;
  undefined8 extraout_RAX;
  allocator local_59;
  string local_58;
  Type local_38;
  
  iVar1 = this->token_;
  if (iVar1 - 0xdU < 0xc) {
    type->base_type = iVar1 - BASE_TYPE_FLOAT;
LAB_00110f79:
    Next(this);
    return;
  }
  if (iVar1 == 0x5b) {
    Next(this);
    local_38.base_type = BASE_TYPE_NONE;
    local_38.element = BASE_TYPE_NONE;
    local_38.struct_def = (StructDef *)0x0;
    local_38.enum_def = (EnumDef *)0x0;
    ParseType(this,&local_38);
    if (local_38.base_type != BASE_TYPE_UNION) {
      if (local_38.base_type != BASE_TYPE_VECTOR) {
        type->base_type = BASE_TYPE_VECTOR;
        type->struct_def = local_38.struct_def;
        type->enum_def = (EnumDef *)0x0;
        type->element = local_38.base_type;
        Expect(this,0x5d);
        return;
      }
      goto LAB_00111099;
    }
  }
  else {
    if (iVar1 == 4) {
      pEVar3 = SymbolTable<flatbuffers::EnumDef>::Lookup(&this->enums_,&this->attribute_);
      if (pEVar3 == (EnumDef *)0x0) {
        type->base_type = BASE_TYPE_STRUCT;
        pSVar4 = LookupCreateStruct(this,&this->attribute_);
        type->struct_def = pSVar4;
      }
      else {
        type->enum_def = (pEVar3->underlying_type).enum_def;
        BVar2 = (pEVar3->underlying_type).element;
        pSVar4 = (pEVar3->underlying_type).struct_def;
        type->base_type = (pEVar3->underlying_type).base_type;
        type->element = BVar2;
        type->struct_def = pSVar4;
        if (pEVar3->is_union == true) {
          type->base_type = BASE_TYPE_UNION;
        }
      }
      goto LAB_00110f79;
    }
    std::__cxx11::string::string((string *)&local_58,"illegal type syntax",(allocator *)&local_38);
    Error(&local_58);
  }
  std::__cxx11::string::string
            ((string *)&local_58,"vector of union types not supported (wrap in table first).",
             &local_59);
  Error(&local_58);
LAB_00111099:
  std::__cxx11::string::string
            ((string *)&local_58,"nested vector types not supported (wrap in table first).",
             &local_59);
  Error(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::ParseType(Type &type) {
  if (token_ >= kTokenBOOL && token_ <= kTokenSTRING) {
    type.base_type = static_cast<BaseType>(token_ - kTokenNONE);
  } else {
    if (token_ == kTokenIdentifier) {
      auto enum_def = enums_.Lookup(attribute_);
      if (enum_def) {
        type = enum_def->underlying_type;
        if (enum_def->is_union) type.base_type = BASE_TYPE_UNION;
      } else {
        type.base_type = BASE_TYPE_STRUCT;
        type.struct_def = LookupCreateStruct(attribute_);
      }
    } else if (token_ == '[') {
      Next();
      Type subtype;
      ParseType(subtype);
      if (subtype.base_type == BASE_TYPE_VECTOR) {
        // We could support this, but it will complicate things, and it's
        // easier to work around with a struct around the inner vector.
        Error("nested vector types not supported (wrap in table first).");
      }
      if (subtype.base_type == BASE_TYPE_UNION) {
        // We could support this if we stored a struct of 2 elements per
        // union element.
        Error("vector of union types not supported (wrap in table first).");
      }
      type = Type(BASE_TYPE_VECTOR, subtype.struct_def);
      type.element = subtype.base_type;
      Expect(']');
      return;
    } else {
      Error("illegal type syntax");
    }
  }
  Next();
}